

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

void xmlParserInputShrink(xmlParserInputPtr in)

{
  size_t sVar1;
  size_t ret;
  size_t used;
  xmlParserInputPtr in_local;
  
  if ((((in != (xmlParserInputPtr)0x0) && (in->buf != (xmlParserInputBufferPtr)0x0)) &&
      (in->base != (xmlChar *)0x0)) &&
     (((in->cur != (xmlChar *)0x0 && (in->buf->buffer != (xmlBufPtr)0x0)) &&
      (ret = (long)in->cur - (long)in->base, 0x50 < ret)))) {
    sVar1 = xmlBufShrink(in->buf->buffer,ret - 0x50);
    if (sVar1 != 0) {
      ret = ret - sVar1;
      if (-sVar1 - 1 < in->consumed) {
        in->consumed = 0xffffffffffffffff;
      }
      else {
        in->consumed = sVar1 + in->consumed;
      }
    }
    xmlBufUpdateInput(in->buf->buffer,in,ret);
  }
  return;
}

Assistant:

void
xmlParserInputShrink(xmlParserInputPtr in) {
    size_t used;
    size_t ret;

    if (in == NULL) return;
    if (in->buf == NULL) return;
    if (in->base == NULL) return;
    if (in->cur == NULL) return;
    if (in->buf->buffer == NULL) return;

    used = in->cur - in->base;

    if (used > LINE_LEN) {
	ret = xmlBufShrink(in->buf->buffer, used - LINE_LEN);
	if (ret > 0) {
            used -= ret;
            if ((ret > ULONG_MAX) ||
                (in->consumed > ULONG_MAX - (unsigned long)ret))
                in->consumed = ULONG_MAX;
            else
                in->consumed += ret;
	}

        xmlBufUpdateInput(in->buf->buffer, in, used);
    }
}